

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_plt_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  undefined8 in_RAX;
  int iVar2;
  OPJ_BYTE *p_buffer;
  bool bVar3;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_Zplt;
  
  if (p_header_size != 0) {
    _l_tmp = in_RAX;
    opj_read_bytes_LE(p_header_data,&l_Zplt,1);
    iVar2 = p_header_size - 1;
    p_buffer = p_header_data + 1;
    uVar1 = 0;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      opj_read_bytes_LE(p_buffer,&l_tmp,1);
      uVar1 = (l_tmp & 0x7f | uVar1) << 7 & (int)(char)_l_tmp;
      p_buffer = p_buffer + 1;
    }
    if (uVar1 == 0) {
      return 1;
    }
  }
  opj_event_msg_v2(p_manager,1,"Error reading PLM marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_plt_v2 (
						opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_Zplt, l_tmp, l_packet_len = 0, i;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PLM marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_Zplt,1);		/* Zplt */
	++p_header_data;
	--p_header_size;

	for (i = 0; i < p_header_size; ++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);		/* Iplt_ij */
		++p_header_data;
		/* take only the last seven bytes */
		l_packet_len |= (l_tmp & 0x7f);
		if (l_tmp & 0x80) {
			l_packet_len <<= 7;
		}
		else {
            /* store packet length and proceed to next packet */
			l_packet_len = 0;
		}
	}

	if (l_packet_len != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PLM marker\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}